

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# caching_file_system.cpp
# Opt level: O2

void __thiscall
duckdb::CachingFileHandle::CachingFileHandle
          (CachingFileHandle *this,CachingFileSystem *caching_file_system_p,OpenFileInfo *path_p,
          FileOpenFlags flags_p,CachedFile *cached_file_p)

{
  bool bVar1;
  _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::Value>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::Value>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
  *this_00;
  const_iterator cVar2;
  undefined8 uVar3;
  unique_ptr<duckdb::StorageLockKey,_std::default_delete<duckdb::StorageLockKey>,_true> guard;
  allocator local_49;
  key_type local_48;
  
  uVar3 = flags_p._8_8_;
  this->caching_file_system = caching_file_system_p;
  this->external_file_cache = caching_file_system_p->external_file_cache;
  OpenFileInfo::OpenFileInfo(&this->path,path_p);
  (this->flags).flags = flags_p.flags;
  (this->flags).lock = (char)uVar3;
  (this->flags).compression = (char)((ulong)uVar3 >> 8);
  *(int6 *)&(this->flags).field_0xa = (int6)((ulong)uVar3 >> 0x10);
  this->validate = true;
  this->cached_file = cached_file_p;
  (this->file_handle).super_unique_ptr<duckdb::FileHandle,_std::default_delete<duckdb::FileHandle>_>
  ._M_t.super___uniq_ptr_impl<duckdb::FileHandle,_std::default_delete<duckdb::FileHandle>_>._M_t.
  super__Tuple_impl<0UL,_duckdb::FileHandle_*,_std::default_delete<duckdb::FileHandle>_>.
  super__Head_base<0UL,_duckdb::FileHandle_*,_false>._M_head_impl = (FileHandle *)0x0;
  (this->version_tag)._M_dataplus._M_p = (pointer)&(this->version_tag).field_2;
  (this->version_tag)._M_string_length = 0;
  (this->version_tag).field_2._M_local_buf[0] = '\0';
  this->position = 0;
  if ((this->path).extended_info.internal.
      super___shared_ptr<duckdb::ExtendedOpenFileInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr !=
      (element_type *)0x0) {
    this_00 = (_Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::Value>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::Value>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
               *)shared_ptr<duckdb::ExtendedOpenFileInfo,_true>::operator->
                           (&(this->path).extended_info);
    ::std::__cxx11::string::string((string *)&local_48,"validate_external_file_cache",&local_49);
    cVar2 = std::
            _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::Value>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::Value>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
            ::find(this_00,&local_48);
    ::std::__cxx11::string::~string((string *)&local_48);
    if (cVar2.
        super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::Value>,_true>
        ._M_cur != (__node_type *)0x0) {
      bVar1 = BooleanValue::Get((Value *)((long)cVar2.
                                                super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::Value>,_true>
                                                ._M_cur + 0x28));
      this->validate = bVar1;
    }
  }
  if ((((this->external_file_cache->enable)._M_base._M_i & 1U) == 0) || (this->validate == true)) {
    GetFileHandle(this);
  }
  else {
    StorageLock::GetSharedLock((StorageLock *)&local_48);
    if ((this->cached_file->ranges)._M_t._M_impl.super__Rb_tree_header._M_node_count == 0) {
      ::std::__uniq_ptr_impl<duckdb::StorageLockKey,_std::default_delete<duckdb::StorageLockKey>_>::
      reset((__uniq_ptr_impl<duckdb::StorageLockKey,_std::default_delete<duckdb::StorageLockKey>_> *
            )&local_48,(pointer)0x0);
      GetFileHandle(this);
    }
    ::std::unique_ptr<duckdb::StorageLockKey,_std::default_delete<duckdb::StorageLockKey>_>::
    ~unique_ptr((unique_ptr<duckdb::StorageLockKey,_std::default_delete<duckdb::StorageLockKey>_> *)
                &local_48);
  }
  return;
}

Assistant:

CachingFileHandle::CachingFileHandle(CachingFileSystem &caching_file_system_p, const OpenFileInfo &path_p,
                                     FileOpenFlags flags_p, CachedFile &cached_file_p)
    : caching_file_system(caching_file_system_p), external_file_cache(caching_file_system.external_file_cache),
      path(path_p), flags(flags_p), validate(true), cached_file(cached_file_p), position(0) {
	if (path.extended_info) {
		const auto &open_options = path.extended_info->options;
		const auto validate_entry = open_options.find("validate_external_file_cache");
		if (validate_entry != open_options.end()) {
			validate = BooleanValue::Get(validate_entry->second);
		}
	}
	if (!external_file_cache.IsEnabled() || validate) {
		// If caching is disabled, or if we must validate cache entries, we always have to open the file
		GetFileHandle();
		return;
	}
	// If we don't have any cached file ranges, we must also open the file
	auto guard = cached_file.lock.GetSharedLock();
	if (cached_file.Ranges(guard).empty()) {
		guard.reset();
		GetFileHandle();
	}
}